

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O1

void __thiscall VRle::Data::opIntersect(Data *this,View a,View b)

{
  pointer pSVar1;
  size_t sVar2;
  Span *pSVar3;
  long lVar4;
  Span *pSVar5;
  ulong __n;
  size_t sVar6;
  Result result;
  rle_view local_840;
  rle_view local_830;
  Span local_820 [255];
  
  sVar6 = b._size;
  pSVar3 = b._data;
  sVar2 = a._size;
  pSVar5 = a._data;
  local_830._data = pSVar3;
  local_840._data = pSVar5;
  if (sVar2 != 0) {
    lVar4 = sVar2 << 3;
    do {
      if (pSVar3->y <= (local_840._data)->y) {
        if (sVar6 != 0) {
          lVar4 = sVar6 << 3;
          goto LAB_00111a25;
        }
        break;
      }
      local_840._data = local_840._data + 1;
      lVar4 = lVar4 + -8;
    } while (lVar4 != 0);
  }
  goto LAB_00111a36;
  while( true ) {
    local_830._data = local_830._data + 1;
    lVar4 = lVar4 + -8;
    if (lVar4 == 0) break;
LAB_00111a25:
    if ((local_840._data)->y <= (local_830._data)->y) break;
  }
LAB_00111a36:
  local_840._size = (long)((long)pSVar5 + (sVar2 * 8 - (long)local_840._data)) >> 3;
  local_830._size = (long)((long)pSVar3 + (sVar6 * 8 - (long)local_830._data)) >> 3;
  lVar4 = 0;
  do {
    *(undefined4 *)((long)&local_820[0].y + lVar4 + 1) = 0;
    *(undefined4 *)((long)&local_820[0].x + lVar4) = 0;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x7f8);
  if (local_840._size != 0) {
    do {
      sVar2 = _opIntersect(&local_840,&local_830,(Result *)local_820);
      if (sVar2 != 0) {
        pSVar1 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
                 super__Vector_impl_data._M_start;
        __n = ((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) + sVar2;
        if ((ulong)((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar1 >> 3) <
            __n) {
          std::vector<VRle::Span,_std::allocator<VRle::Span>_>::reserve(&this->mSpans,__n);
        }
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<VRle::Span_const*,std::back_insert_iterator<std::vector<VRle::Span,std::allocator<VRle::Span>>>>
                  (local_820,local_820 + sVar2,
                   (back_insert_iterator<std::vector<VRle::Span,_std::allocator<VRle::Span>_>_>)this
                  );
      }
    } while (local_840._size != 0);
  }
  updateBbox(this);
  return;
}

Assistant:

void VRle::Data::opIntersect(VRle::View a, VRle::View b)
{
    _opIntersectPrepare(a, b);
    Result result;
    while (a.size()) {
        auto count = _opIntersect(a, b, result);
        if (count) copy(result.data(), count, mSpans);
    }

    updateBbox();
}